

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O2

void __thiscall MovingParam::moveTo(MovingParam *this,double tval,double _startTS)

{
  bool bVar1;
  ulong uVar2;
  double __z;
  double dVar3;
  
  dVar3 = this->defMax;
  if (tval <= this->defMax) {
    dVar3 = tval;
  }
  uVar2 = -(ulong)(tval < this->defMin);
  dVar3 = (double)(uVar2 & (ulong)this->defMin | ~uVar2 & (ulong)dVar3);
  bVar1 = dequal(dVar3,this->val);
  if (bVar1) {
    SetVal(this,dVar3);
    return;
  }
  bVar1 = dequal(this->valTo,dVar3);
  if (!bVar1) {
    this->valFrom = this->val;
    this->valTo = dVar3;
    dVar3 = dVar3 - this->val;
    this->valDist = dVar3;
    this->bIncrease = 0.0 < dVar3;
    __z = (double)((ulong)currCycle.simTime & -(ulong)NAN(_startTS) |
                  ~-(ulong)NAN(_startTS) & (ulong)_startTS);
    this->timeFrom = __z;
    dVar3 = fma(ABS(dVar3 / this->defDist),this->defDuration,__z);
    this->timeTo = dVar3;
  }
  return;
}

Assistant:

void MovingParam::moveTo ( double tval, double _startTS )
{
    // Normalize between limits
    tval = std::clamp<double>(tval, defMin, defMax);
    
    // current value equals target already
    if (dequal(tval, val))
        SetVal(tval);                     // just set the target value bit-euqal, no moving
    // we shall move to a (new) given target:
    // calc required duration by using defining parameters
    else if ( !dequal(valTo, tval) ) {
        // set origin and desired target value
        valFrom = val;
        valTo = tval;
        valDist = valTo - valFrom;
        bIncrease = valDist > 0;

        // full travel from defMin to defMax takes defDuration
        // So: How much time shall we use? = Which share of the full duration do we need?
        // And: When will we be done?
        // timeTo = std::abs(valDist/defDist) * defDuration + timeFrom;
        timeFrom = std::isnan(_startTS) ? currCycle.simTime : _startTS;
        timeTo = fma(std::abs(valDist/defDist), defDuration, timeFrom);
    }
}